

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect.c
# Opt level: O0

void print_valtypes(wasm_valtype_vec_t *types)

{
  bool bVar1;
  ulong local_20;
  size_t i;
  _Bool first;
  wasm_valtype_vec_t *types_local;
  
  bVar1 = true;
  for (local_20 = 0; local_20 < types->size; local_20 = local_20 + 1) {
    if (bVar1) {
      bVar1 = false;
    }
    else {
      printf(" ");
    }
    print_valtype(types->data[local_20]);
  }
  return;
}

Assistant:

void print_valtypes(const wasm_valtype_vec_t* types) {
  bool first = true;
  for (size_t i = 0; i < types->size; ++i) {
    if (first) {
      first = false;
    } else {
      printf(" ");
    }
    print_valtype(types->data[i]);
  }
}